

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

QWidget * __thiscall QScrollArea::takeWidget(QScrollArea *this)

{
  long lVar1;
  QWidget *this_00;
  
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if ((*(long *)(lVar1 + 0x2f8) == 0) || (*(int *)(*(long *)(lVar1 + 0x2f8) + 4) == 0)) {
    this_00 = (QWidget *)0x0;
  }
  else {
    this_00 = *(QWidget **)(lVar1 + 0x300);
  }
  QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)(lVar1 + 0x2f8),(QObject *)0x0);
  if (this_00 != (QWidget *)0x0) {
    QWidget::setParent(this_00,(QWidget *)0x0);
  }
  return this_00;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }